

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O3

int Abs_ManExtendOneEval_rec(Vec_Ptr_t *vSimInfo,Aig_Man_t *p,Aig_Obj_t *pObj,int iFrame)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  
  if ((-1 < iFrame) && (iFrame < vSimInfo->nSize)) {
    uVar6 = *(uint *)((long)vSimInfo->pArray[(uint)iFrame] + (long)(pObj->Id >> 4) * 4) >>
            ((char)pObj->Id * '\x02' & 0x1fU) & 3;
    if (uVar6 != 0) {
      return uVar6;
    }
    if ((*(uint *)&pObj->field_0x18 & 7) == 2) {
      if ((pObj->field_0).CioId < p->nTruePis) {
        __assert_fail("Saig_ObjIsLo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc2.c"
                      ,0xa2,
                      "int Abs_ManExtendOneEval_rec(Vec_Ptr_t *, Aig_Man_t *, Aig_Obj_t *, int)");
      }
      uVar6 = ((pObj->field_0).CioId - p->nTruePis) + p->nTruePos;
      if (((int)uVar6 < 0) || (p->vCos->nSize <= (int)uVar6)) goto LAB_00569d7a;
      uVar2 = Abs_ManExtendOneEval_rec(vSimInfo,p,(Aig_Obj_t *)p->vCos->pArray[uVar6],iFrame + -1);
      iVar4 = vSimInfo->nSize;
    }
    else {
      uVar2 = Abs_ManExtendOneEval_rec
                        (vSimInfo,p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),iFrame)
      ;
      uVar6 = 2;
      if (uVar2 != 1) {
        uVar6 = (uint)(uVar2 != 2) * 2 + 1;
      }
      if (((ulong)pObj->pFanin0 & 1) == 0) {
        uVar6 = uVar2;
      }
      uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
      if ((uVar2 & 7) != 3) {
        if ((uVar2 & 7) - 7 < 0xfffffffe) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc2.c"
                        ,0xaf,
                        "int Abs_ManExtendOneEval_rec(Vec_Ptr_t *, Aig_Man_t *, Aig_Obj_t *, int)");
        }
        uVar2 = 1;
        if (uVar6 != 1) {
          iVar3 = Abs_ManExtendOneEval_rec
                            (vSimInfo,p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),
                             iFrame);
          iVar4 = 2;
          if (iVar3 != 1) {
            iVar4 = (uint)(iVar3 != 2) * 2 + 1;
          }
          if (((ulong)pObj->pFanin1 & 1) == 0) {
            iVar4 = iVar3;
          }
          uVar2 = (iVar4 == 2 && uVar6 == 2) ^ 3;
          if (iVar4 == 1) {
            uVar2 = 1;
          }
        }
        if (vSimInfo->nSize <= iFrame) goto LAB_00569d7a;
        goto LAB_00569d41;
      }
      iVar4 = vSimInfo->nSize;
      uVar2 = uVar6;
    }
    if (iFrame < iVar4) {
      if (3 < uVar2) {
        __assert_fail("Value >= ABS_ZER && Value <= ABS_UND",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc2.c"
                      ,0x8a,"void Abs_ManSimInfoSet(Vec_Ptr_t *, Aig_Obj_t *, int, int)");
      }
LAB_00569d41:
      lVar5 = (long)(pObj->Id >> 4);
      uVar6 = *(uint *)((long)vSimInfo->pArray[(uint)iFrame] + lVar5 * 4);
      bVar1 = (char)pObj->Id * '\x02';
      *(uint *)((long)vSimInfo->pArray[(uint)iFrame] + lVar5 * 4) =
           (uVar6 >> (bVar1 & 0x1f) & 3 ^ uVar2) << (bVar1 & 0x1f) ^ uVar6;
      return uVar2;
    }
  }
LAB_00569d7a:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Abs_ManExtendOneEval_rec( Vec_Ptr_t * vSimInfo, Aig_Man_t * p, Aig_Obj_t * pObj, int iFrame )
{
    int Value0, Value1, Value;
    Value = Abs_ManSimInfoGet( vSimInfo, pObj, iFrame );
    if ( Value )
        return Value;
    if ( Aig_ObjIsCi(pObj) )
    {
        assert( Saig_ObjIsLo(p, pObj) );
        Value = Abs_ManExtendOneEval_rec( vSimInfo, p, Saig_ObjLoToLi(p, pObj), iFrame-1 );
        Abs_ManSimInfoSet( vSimInfo, pObj, iFrame, Value );
        return Value;
    }
    Value0 = Abs_ManExtendOneEval_rec( vSimInfo, p, Aig_ObjFanin0(pObj), iFrame );
    if ( Aig_ObjFaninC0(pObj) )
        Value0 = Abs_ManSimInfoNot( Value0 );
    if ( Aig_ObjIsCo(pObj) )
    {
        Abs_ManSimInfoSet( vSimInfo, pObj, iFrame, Value0 );
        return Value0;
    }
    assert( Aig_ObjIsNode(pObj) );
    if ( Value0 == ABS_ZER )
        Value = ABS_ZER;
    else
    {
        Value1 = Abs_ManExtendOneEval_rec( vSimInfo, p, Aig_ObjFanin1(pObj), iFrame );
        if ( Aig_ObjFaninC1(pObj) )
            Value1 = Abs_ManSimInfoNot( Value1 );
        Value = Abs_ManSimInfoAnd( Value0, Value1 );
    }
    Abs_ManSimInfoSet( vSimInfo, pObj, iFrame, Value );
    assert( Value );
    return Value;
}